

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall flatbuffers::Type::Deserialize(Type *this,Parser *parser,Type *type)

{
  int *piVar1;
  pointer ppEVar2;
  pointer ppSVar3;
  StructDef *pSVar4;
  long lVar5;
  unsigned_short vtsize;
  ushort uVar6;
  uint16_t uVar7;
  BaseType BVar8;
  ushort uVar9;
  ulong uVar10;
  bool bVar11;
  
  if (type == (Type *)0x0) {
    return true;
  }
  lVar5 = -(long)*(int *)type;
  uVar6 = *(ushort *)(type + -(long)*(int *)type);
  BVar8 = BASE_TYPE_NONE;
  uVar9 = 0;
  if (4 < uVar6) {
    uVar9 = *(ushort *)(type + lVar5 + 4);
  }
  if (uVar9 != 0) {
    BVar8 = (BaseType)(char)type[uVar9].super_Table;
  }
  this->base_type = BVar8;
  BVar8 = BASE_TYPE_NONE;
  uVar10 = 0;
  if (6 < uVar6) {
    uVar10 = (ulong)*(ushort *)(type + lVar5 + 6);
  }
  if ((short)uVar10 != 0) {
    BVar8 = (BaseType)(char)type[uVar10].super_Table;
  }
  this->element = BVar8;
  if (uVar6 < 0xb) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(type + lVar5 + 10);
  }
  if (uVar6 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(uint16_t *)(type + uVar6);
  }
  this->fixed_length = uVar7;
  uVar6 = *(ushort *)(type + lVar5);
  if (uVar6 < 9) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(ushort *)(type + lVar5 + 8);
  }
  if (uVar9 == 0) {
    return true;
  }
  if (*(int *)(type + uVar9) < 0) {
    return true;
  }
  if (uVar6 < 5) {
    uVar10 = 0;
  }
  else {
    uVar10 = (ulong)*(ushort *)(type + lVar5 + 4);
  }
  if (((short)uVar10 == 0) || (bVar11 = true, type[uVar10].super_Table != (Table)0xe)) {
    if (uVar6 < 5) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(type + lVar5 + 4);
    }
    if (uVar9 == 0) {
      bVar11 = false;
    }
    else {
      bVar11 = type[uVar9].super_Table == (Table)0x11;
    }
  }
  if (uVar6 < 5) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(ushort *)(type + lVar5 + 4);
  }
  if ((uVar9 == 0) || (type[uVar9].super_Table != (Table)0xf)) {
    if (bVar11) {
      if (uVar6 < 7) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)*(ushort *)(type + lVar5 + 6);
      }
      if (((short)uVar10 != 0) && (type[uVar10].super_Table == (Table)0xf)) goto LAB_00134c48;
    }
    if (uVar6 < 9) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(type + lVar5 + 8);
    }
    if (uVar9 == 0) {
      uVar10 = 0xffffffffffffffff;
    }
    else {
      uVar10 = (ulong)*(int *)(type + uVar9);
    }
    ppEVar2 = (parser->enums_).vec.
              super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (uVar10 < (ulong)((long)(parser->enums_).vec.
                               super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3)) {
      if (uVar6 < 9) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ushort *)(type + lVar5 + 8);
      }
      if (uVar6 == 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = (long)*(int *)(type + uVar6);
      }
      this->enum_def = ppEVar2[lVar5];
      return true;
    }
  }
  else {
LAB_00134c48:
    if (uVar6 < 9) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(type + lVar5 + 8);
    }
    if (uVar9 == 0) {
      uVar10 = 0xffffffffffffffff;
    }
    else {
      uVar10 = (ulong)*(int *)(type + uVar9);
    }
    ppSVar3 = (parser->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar10 < (ulong)((long)(parser->structs_).vec.
                               super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3)) {
      if (uVar6 < 9) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ushort *)(type + lVar5 + 8);
      }
      if (uVar6 == 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = (long)*(int *)(type + uVar6);
      }
      pSVar4 = ppSVar3[lVar5];
      this->struct_def = pSVar4;
      piVar1 = &(pSVar4->super_Definition).refcount;
      *piVar1 = *piVar1 + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool Type::Deserialize(const Parser &parser, const reflection::Type *type) {
  if (type == nullptr) return true;
  base_type = static_cast<BaseType>(type->base_type());
  element = static_cast<BaseType>(type->element());
  fixed_length = type->fixed_length();
  if (type->index() >= 0) {
    bool is_series = type->base_type() == reflection::Vector ||
                     type->base_type() == reflection::Array;
    if (type->base_type() == reflection::Obj ||
        (is_series && type->element() == reflection::Obj)) {
      if (static_cast<size_t>(type->index()) < parser.structs_.vec.size()) {
        struct_def = parser.structs_.vec[type->index()];
        struct_def->refcount++;
      } else {
        return false;
      }
    } else {
      if (static_cast<size_t>(type->index()) < parser.enums_.vec.size()) {
        enum_def = parser.enums_.vec[type->index()];
      } else {
        return false;
      }
    }
  }
  return true;
}